

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
pstore::json::details::number_matcher<pstore::json::null_output>::do_exponent_sign_state
          (number_matcher<pstore::json::null_output> *this,parser<pstore::json::null_output> *parser
          ,char c)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  error_category *peVar4;
  error_code err;
  
  if ((this->super_matcher<pstore::json::null_output>).field_0xd == '\x01') {
    (this->fp_acc_).whole_part =
         ((double)CONCAT44(0x45300000,(int)(this->int_acc_ >> 0x20)) - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)this->int_acc_) - 4503599627370496.0);
    (this->super_matcher<pstore::json::null_output>).field_0xd = 0;
  }
  (this->super_matcher<pstore::json::null_output>).state_ = 9;
  if (c == '-') {
    (this->fp_acc_).exp_is_negative = true;
  }
  else {
    if (c != '+') {
      iVar1 = (this->super_matcher<pstore::json::null_output>).state_;
      if (1 < iVar1 - 9U) {
        assert_failed("this->get_state () == exponent_digit_state || this->get_state () == exponent_initial_digit_state"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x2ab);
      }
      if ((this->super_matcher<pstore::json::null_output>).field_0xd != '\x01') {
        if ((byte)(c - 0x30U) < 10) {
          (this->fp_acc_).exponent = ((uint)(byte)c + (this->fp_acc_).exponent * 10) - 0x30;
          (this->super_matcher<pstore::json::null_output>).state_ = 10;
          bVar2 = true;
        }
        else if (iVar1 == 9) {
          peVar4 = get_error_category();
          err._M_cat = peVar4;
          err._0_8_ = 0xb;
          bVar3 = parser<pstore::json::null_output>::set_error(parser,err);
          bVar2 = true;
          if (bVar3) {
            (this->super_matcher<pstore::json::null_output>).state_ = 1;
          }
        }
        else {
          (this->super_matcher<pstore::json::null_output>).state_ = 1;
          make_result(this,parser);
          bVar2 = false;
        }
        return bVar2;
      }
      assert_failed("!is_integer_",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x2ac);
    }
    (this->fp_acc_).exp_is_negative = false;
  }
  return true;
}

Assistant:

void number_matcher<Callbacks>::number_is_float () {
                if (is_integer_) {
                    fp_acc_.whole_part = static_cast<double> (int_acc_);
                    is_integer_ = false;
                }
            }